

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O3

bool __thiscall
bssl::tls13_psk_binder
          (bssl *this,uint8_t *out,size_t *out_len,SSL_SESSION *session,SSLTranscript *transcript,
          Span<const_unsigned_char> client_hello,size_t binders_len,bool is_dtls)

{
  long lVar1;
  string_view label;
  Span<const_unsigned_char> secret;
  Span<const_unsigned_char> hash;
  Span<const_unsigned_char> context_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  EVP_MD *md;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  ulong cnt;
  Span<const_unsigned_char> secret_00;
  Span<unsigned_char> out_00;
  uint context_len;
  uint binder_context_len;
  ScopedEVP_MD_CTX ctx;
  size_t early_secret_len;
  uint8_t binder_key_buf [64];
  uint8_t early_secret [64];
  uint8_t context [64];
  uint8_t binder_context [64];
  undefined4 uVar6;
  uchar *md_00;
  uint local_1ac;
  SSLTranscript *local_1a8;
  uint local_19c;
  long *local_198;
  SSL_SESSION *local_190;
  EVP_MD_CTX local_188;
  uchar *local_158;
  ulong uStack_150;
  undefined8 local_148;
  char *pcStack_140;
  EVP_MD local_138;
  undefined8 local_108;
  undefined8 uStack_100;
  uint8_t local_f8 [64];
  uchar local_b8 [64];
  uchar local_78 [72];
  
  local_1a8 = transcript;
  local_198 = (long *)out;
  local_190 = session;
  local_188.pctx = (EVP_PKEY_CTX *)this;
  md = (EVP_MD *)ssl_session_get_digest((SSL_SESSION *)out_len);
  local_f8[0x30] = '\0';
  local_f8[0x31] = '\0';
  local_f8[0x32] = '\0';
  local_f8[0x33] = '\0';
  local_f8[0x34] = '\0';
  local_f8[0x35] = '\0';
  local_f8[0x36] = '\0';
  local_f8[0x37] = '\0';
  local_f8[0x38] = '\0';
  local_f8[0x39] = '\0';
  local_f8[0x3a] = '\0';
  local_f8[0x3b] = '\0';
  local_f8[0x3c] = '\0';
  local_f8[0x3d] = '\0';
  local_f8[0x3e] = '\0';
  local_f8[0x3f] = '\0';
  local_f8[0x20] = '\0';
  local_f8[0x21] = '\0';
  local_f8[0x22] = '\0';
  local_f8[0x23] = '\0';
  local_f8[0x24] = '\0';
  local_f8[0x25] = '\0';
  local_f8[0x26] = '\0';
  local_f8[0x27] = '\0';
  local_f8[0x28] = '\0';
  local_f8[0x29] = '\0';
  local_f8[0x2a] = '\0';
  local_f8[0x2b] = '\0';
  local_f8[0x2c] = '\0';
  local_f8[0x2d] = '\0';
  local_f8[0x2e] = '\0';
  local_f8[0x2f] = '\0';
  local_f8[0x10] = '\0';
  local_f8[0x11] = '\0';
  local_f8[0x12] = '\0';
  local_f8[0x13] = '\0';
  local_f8[0x14] = '\0';
  local_f8[0x15] = '\0';
  local_f8[0x16] = '\0';
  local_f8[0x17] = '\0';
  local_f8[0x18] = '\0';
  local_f8[0x19] = '\0';
  local_f8[0x1a] = '\0';
  local_f8[0x1b] = '\0';
  local_f8[0x1c] = '\0';
  local_f8[0x1d] = '\0';
  local_f8[0x1e] = '\0';
  local_f8[0x1f] = '\0';
  local_f8[0] = '\0';
  local_f8[1] = '\0';
  local_f8[2] = '\0';
  local_f8[3] = '\0';
  local_f8[4] = '\0';
  local_f8[5] = '\0';
  local_f8[6] = '\0';
  local_f8[7] = '\0';
  local_f8[8] = '\0';
  local_f8[9] = '\0';
  local_f8[10] = '\0';
  local_f8[0xb] = '\0';
  local_f8[0xc] = '\0';
  local_f8[0xd] = '\0';
  local_f8[0xe] = '\0';
  local_f8[0xf] = '\0';
  local_108 = 0;
  uStack_100 = 0;
  local_138.final = (_func_void_EVP_MD_CTX_ptr_uint8_t_ptr *)0x0;
  local_138.block_size = 0;
  local_138.ctx_size = 0;
  local_138.init = (_func_void_EVP_MD_CTX_ptr *)0x0;
  local_138.update = (_func_void_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0;
  local_138.type = 0;
  local_138.md_size = 0;
  local_138.flags = 0;
  local_138._12_4_ = 0;
  iVar3 = EVP_MD_size(md);
  out_00.size_._4_4_ = extraout_var;
  out_00.size_._0_4_ = iVar3;
  md_00 = local_78;
  iVar4 = EVP_Digest((void *)0x0,0,md_00,&local_19c,md,(ENGINE *)0x0);
  if (iVar4 == 0) {
    return false;
  }
  iVar4 = HKDF_extract(local_f8,(size_t *)&local_188.update,(EVP_MD *)md,
                       (uint8_t *)((long)out_len + 10),(ulong)*(byte *)((long)out_len + 0x4a),
                       (uint8_t *)0x0,0);
  if (iVar4 == 0) {
    return false;
  }
  local_148 = 10;
  pcStack_140 = "res binder";
  uVar5 = (ulong)local_19c;
  uVar6 = 0;
  label._M_str._0_4_ = 0x34fc19;
  label._M_len = 10;
  label._M_str._4_4_ = 0;
  hash.size_._0_4_ = local_19c;
  hash.data_ = md_00;
  hash.size_._4_4_ = 0;
  secret_00.size_ = (size_t)local_188.update;
  secret_00.data_ = local_f8;
  out_00.data_ = (uchar *)&local_138;
  local_158 = md_00;
  uStack_150 = uVar5;
  bVar2 = hkdf_expand_label(out_00,(EVP_MD *)md,secret_00,label,hash,client_hello.size_._0_1_);
  if (!bVar2) {
    return false;
  }
  if (binders_len < client_hello.data_) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x21b);
    return false;
  }
  cnt = binders_len - (long)client_hello.data_;
  if (binders_len < binders_len - (long)client_hello.data_) {
    cnt = binders_len;
  }
  EVP_MD_CTX_init(&local_188);
  if (client_hello.size_._0_1_ == false) {
    bVar2 = SSLTranscript::CopyToHashContext
                      ((SSLTranscript *)local_190,(EVP_MD_CTX *)&local_188,(EVP_MD *)md);
    if ((bVar2) && (iVar4 = EVP_DigestUpdate(&local_188,local_1a8,cnt), iVar4 != 0)) {
      iVar4 = EVP_DigestFinal_ex(&local_188,local_b8,&local_1ac);
      goto LAB_0026b944;
    }
  }
  else if ((((0xb < cnt) &&
            (bVar2 = SSLTranscript::CopyToHashContext
                               ((SSLTranscript *)local_190,(EVP_MD_CTX *)&local_188,(EVP_MD *)md),
            bVar2)) && (iVar4 = EVP_DigestUpdate(&local_188,local_1a8,4), iVar4 != 0)) &&
          (iVar4 = EVP_DigestUpdate(&local_188,(void *)((long)&(local_1a8->hash_).ctx_.digest + 4),
                                    cnt - 0xc), iVar4 != 0)) {
    iVar4 = EVP_DigestFinal_ex(&local_188,local_b8,&local_1ac);
LAB_0026b944:
    if ((iVar4 != 0) &&
       (secret.size_._0_1_ = client_hello.size_._0_1_, secret.data_ = (uchar *)(ulong)local_1ac,
       secret.size_._1_3_ = 0, secret.size_._4_4_ = uVar6, context_00.size_ = uVar5,
       context_00.data_ = md_00,
       bVar2 = tls13_verify_data((bssl *)local_188.pctx,(uint8_t *)local_198,(size_t *)md,&local_138
                                 ,(uint16_t)iVar3,secret,context_00,SUB81(local_b8,0)), bVar2)) {
      lVar1 = *local_198;
      iVar3 = EVP_MD_size(md);
      bVar2 = true;
      if (lVar1 != CONCAT44(extraout_var_00,iVar3)) {
        __assert_fail("*out_len == EVP_MD_size(digest)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                      ,0x240,
                      "bool bssl::tls13_psk_binder(uint8_t *, size_t *, const SSL_SESSION *, const SSLTranscript &, Span<const uint8_t>, size_t, bool)"
                     );
      }
      goto LAB_0026b9b6;
    }
  }
  bVar2 = false;
LAB_0026b9b6:
  EVP_MD_CTX_cleanup(&local_188);
  return bVar2;
}

Assistant:

static bool tls13_psk_binder(uint8_t *out, size_t *out_len,
                             const SSL_SESSION *session,
                             const SSLTranscript &transcript,
                             Span<const uint8_t> client_hello,
                             size_t binders_len, bool is_dtls) {
  const EVP_MD *digest = ssl_session_get_digest(session);

  // Compute the binder key.
  //
  // TODO(davidben): Ideally we wouldn't recompute early secret and the binder
  // key each time.
  uint8_t binder_context[EVP_MAX_MD_SIZE];
  unsigned binder_context_len;
  uint8_t early_secret[EVP_MAX_MD_SIZE] = {0};
  size_t early_secret_len;
  uint8_t binder_key_buf[EVP_MAX_MD_SIZE] = {0};
  auto binder_key = Span(binder_key_buf, EVP_MD_size(digest));
  if (!EVP_Digest(nullptr, 0, binder_context, &binder_context_len, digest,
                  nullptr) ||
      !HKDF_extract(early_secret, &early_secret_len, digest,
                    session->secret.data(), session->secret.size(), nullptr,
                    0) ||
      !hkdf_expand_label(binder_key, digest,
                         Span(early_secret, early_secret_len),
                         kTLS13LabelPSKBinder,
                         Span(binder_context, binder_context_len), is_dtls)) {
    return false;
  }

  // Hash the transcript and truncated ClientHello.
  if (client_hello.size() < binders_len) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  auto truncated = client_hello.subspan(0, client_hello.size() - binders_len);
  uint8_t context[EVP_MAX_MD_SIZE];
  unsigned context_len;
  ScopedEVP_MD_CTX ctx;
  if (!is_dtls) {
    if (!transcript.CopyToHashContext(ctx.get(), digest) ||
        !EVP_DigestUpdate(ctx.get(), truncated.data(), truncated.size()) ||
        !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
      return false;
    }
  } else {
    // In DTLS 1.3, the transcript hash is computed over only the TLS 1.3
    // handshake messages (i.e. only type and length in the header), not the
    // full DTLSHandshake messages that are in |truncated|. This code pulls
    // the header and body out of the truncated ClientHello and writes those
    // to the hash context so the correct binder value is computed.
    if (truncated.size() < DTLS1_HM_HEADER_LENGTH) {
      return false;
    }
    auto header = truncated.subspan(0, 4);
    auto body = truncated.subspan(12);
    if (!transcript.CopyToHashContext(ctx.get(), digest) ||
        !EVP_DigestUpdate(ctx.get(), header.data(), header.size()) ||
        !EVP_DigestUpdate(ctx.get(), body.data(), body.size()) ||
        !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
      return false;
    }
  }

  if (!tls13_verify_data(out, out_len, digest, session->ssl_version, binder_key,
                         Span(context, context_len), is_dtls)) {
    return false;
  }

  assert(*out_len == EVP_MD_size(digest));
  return true;
}